

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O2

void amrex::parser_ast_regvar(parser_node *node,char *name,int i)

{
  int iVar1;
  ostream *os_;
  Print *pPVar2;
  long lStack_1c0;
  Print PStack_1b8;
  
  do {
    lStack_1c0 = 8;
    switch(node->type) {
    case PARSER_NUMBER:
      return;
    case PARSER_SYMBOL:
      iVar1 = strcmp(name,(char *)node->l);
      if (iVar1 != 0) {
        return;
      }
      *(int *)&node->r = i;
      return;
    case PARSER_ADD:
    case PARSER_SUB:
    case PARSER_MUL:
    case PARSER_DIV:
    case PARSER_F2:
    case PARSER_LIST:
      parser_ast_regvar(node->l,name,i);
    case PARSER_ASSIGN:
      lStack_1c0 = 0x10;
      break;
    case PARSER_NEG:
    case PARSER_F1:
      break;
    case PARSER_F3:
      parser_ast_regvar(node->l,name,i);
      parser_ast_regvar(node->r,name,i);
      lStack_1c0 = 0x18;
      break;
    case PARSER_ADD_VP:
    case PARSER_SUB_VP:
    case PARSER_MUL_VP:
    case PARSER_DIV_VP:
      parser_ast_regvar(node->r,name,i);
      iVar1 = *(int *)&node->r->r;
      goto LAB_006c9514;
    case PARSER_ADD_PP:
    case PARSER_SUB_PP:
    case PARSER_MUL_PP:
    case PARSER_DIV_PP:
      parser_ast_regvar(node->l,name,i);
      parser_ast_regvar(node->r,name,i);
      (node->lvp).ip = *(int *)&node->l->r;
      iVar1 = *(int *)&node->r->r;
LAB_006c9514:
      node->rip = iVar1;
      return;
    case PARSER_NEG_P:
      parser_ast_regvar(node->l,name,i);
      (node->lvp).ip = *(int *)&node->l->r;
      return;
    default:
      os_ = OutStream();
      AllPrint::AllPrint((AllPrint *)&PStack_1b8,os_);
      std::operator<<((ostream *)&PStack_1b8.ss,"parser_ast_regvar: unknown node type ");
      pPVar2 = Print::operator<<(&PStack_1b8,&node->type);
      std::operator<<((ostream *)&pPVar2->ss,"\n");
      Print::~Print(&PStack_1b8);
      Abort_host((char *)0x0);
      return;
    }
    node = *(parser_node **)((long)&node->type + lStack_1c0);
  } while( true );
}

Assistant:

void
parser_ast_regvar (struct parser_node* node, char const* name, int i)
{
    switch (node->type)
    {
    case PARSER_NUMBER:
        break;
    case PARSER_SYMBOL:
        if (std::strcmp(name, ((struct parser_symbol*)node)->name) == 0) {
            ((struct parser_symbol*)node)->ip = i;
        }
        break;
    case PARSER_ADD:
    case PARSER_SUB:
    case PARSER_MUL:
    case PARSER_DIV:
    case PARSER_LIST:
        parser_ast_regvar(node->l, name, i);
        parser_ast_regvar(node->r, name, i);
        break;
    case PARSER_NEG:
        parser_ast_regvar(node->l, name, i);
        break;
    case PARSER_F1:
        parser_ast_regvar(((struct parser_f1*)node)->l, name, i);
        break;
    case PARSER_F2:
        parser_ast_regvar(((struct parser_f2*)node)->l, name, i);
        parser_ast_regvar(((struct parser_f2*)node)->r, name, i);
        break;
    case PARSER_F3:
        parser_ast_regvar(((struct parser_f3*)node)->n1, name, i);
        parser_ast_regvar(((struct parser_f3*)node)->n2, name, i);
        parser_ast_regvar(((struct parser_f3*)node)->n3, name, i);
        break;
    case PARSER_ASSIGN:
        parser_ast_regvar(((struct parser_assign*)node)->v, name, i);
        break;
    case PARSER_ADD_VP:
    case PARSER_SUB_VP:
    case PARSER_MUL_VP:
    case PARSER_DIV_VP:
        parser_ast_regvar(node->r, name, i);
        node->rip = ((struct parser_symbol*)(node->r))->ip;
        break;
    case PARSER_NEG_P:
        parser_ast_regvar(node->l, name, i);
        node->lvp.ip = ((struct parser_symbol*)(node->l))->ip;
        break;
    case PARSER_ADD_PP:
    case PARSER_SUB_PP:
    case PARSER_MUL_PP:
    case PARSER_DIV_PP:
        parser_ast_regvar(node->l, name, i);
        parser_ast_regvar(node->r, name, i);
        node->lvp.ip = ((struct parser_symbol*)(node->l))->ip;
        node->rip = ((struct parser_symbol*)(node->r))->ip;
        break;
    default:
        amrex::AllPrint() << "parser_ast_regvar: unknown node type " << node->type << "\n";
        amrex::Abort();
    }
}